

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type __thiscall
FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>
::dx(FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>
     *this,int i)

{
  value_type vVar1;
  value_type vVar2;
  value_type vVar3;
  value_type vVar4;
  value_type vVar5;
  value_type vVar6;
  int in_stack_ffffffffffffffbc;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *in_stack_ffffffffffffffc0;
  
  vVar1 = FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::dx
                    (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  vVar2 = FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::val
                    ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)0x15c8157);
  vVar3 = FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::dx
                    ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffffc0,
                     in_stack_ffffffffffffffbc);
  vVar4 = FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::val
                    ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)0x15c8182);
  vVar5 = FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::val
                    ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)0x15c81ce);
  vVar6 = FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::val
                    ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)0x15c81e2);
  return (vVar1 * vVar2 + -(vVar3 * vVar4)) / (vVar5 * vVar6);
}

Assistant:

const value_type dx(int i) const {return  (left_.dx(i) * right_.val() - right_.dx(i) * left_.val() ) / (right_.val() * right_.val()) ;}